

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<float> fmt::v8::detail::dragonbox::to_decimal<float>(float x)

{
  decimal_fp<float> dVar1;
  bool bVar2;
  uint uVar3;
  carrier_uint cVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  decimal_fp<float> dVar8;
  significand_type local_e4;
  carrier_uint local_dc;
  uint local_c4;
  undefined4 uStack_c0;
  bool approx_y_parity;
  uint32_t dist;
  uint32_t mask;
  carrier_uint two_fl;
  uint32_t r;
  carrier_uint zi;
  carrier_uint two_fr;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta_minus_1;
  cache_entry_type cache;
  byte local_8e;
  byte local_8d;
  int minus_k;
  bool include_right_endpoint;
  uint uStack_88;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  uint br;
  float x_local;
  decimal_fp<float> ret_value;
  carrier_uint zi_1;
  carrier_uint xi;
  cache_entry_type cache_1;
  int local_58;
  int beta_minus_1_1;
  int minus_k_1;
  int iStack_4c;
  decimal_fp<float> ret_value_1;
  int s;
  uint32_t max_quotient2;
  uint32_t mod_inv2;
  uint32_t max_quotient1;
  uint32_t mod_inv1;
  int t;
  int local_28;
  int s_1;
  uint32_t max_quotient2_1;
  uint32_t mod_inv2_1;
  uint32_t max_quotient1_1;
  uint32_t mod_inv1_1;
  int t_1;
  
  significand_mask = (carrier_uint)x;
  uVar3 = bit_cast<unsigned_int,float>((float *)&significand_mask);
  exponent = 0x7fffff;
  uStack_88 = uVar3 & 0x7fffff;
  significand = uVar3;
  cVar4 = exponent_mask<float>();
  uVar3 = (uVar3 & cVar4) >> 0x17;
  if (uVar3 == 0) {
    if (uStack_88 == 0) {
      dVar8.significand = 0;
      dVar8.exponent = 0;
      return dVar8;
    }
    minus_k = -0x95;
  }
  else {
    minus_k = uVar3 - 0x96;
    if (uStack_88 == 0) {
      beta_minus_1_1 = minus_k;
      local_58 = floor_log10_pow2_minus_log10_4_over_3(minus_k);
      iVar6 = beta_minus_1_1;
      iVar5 = floor_log2_pow10(-local_58);
      cache_1._4_4_ = iVar6 + iVar5;
      _zi_1 = cache_accessor<float>::get_cached_power(-local_58);
      ret_value.exponent =
           cache_accessor<float>::compute_left_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&zi_1,cache_1._4_4_);
      ret_value.significand =
           cache_accessor<float>::compute_right_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&zi_1,cache_1._4_4_);
      bVar2 = is_left_endpoint_integer_shorter_interval<float>(beta_minus_1_1);
      if (!bVar2) {
        ret_value.exponent = ret_value.exponent + 1;
      }
      minus_k_1 = ret_value.significand / 10;
      if ((uint)(minus_k_1 * 10) < (uint)ret_value.exponent) {
        local_dc = cache_accessor<float>::compute_round_up_for_shorter_interval_case
                             ((cache_entry_type *)&zi_1,cache_1._4_4_);
        iStack_4c = local_58;
        if ((beta_minus_1_1 < -0x23) || (-0x23 < beta_minus_1_1)) {
          minus_k_1 = local_dc;
          if (local_dc < (uint)ret_value.exponent) {
            minus_k_1 = local_dc + 1;
          }
        }
        else {
          if ((local_dc & 1) != 0) {
            local_dc = local_dc - 1;
          }
          minus_k_1 = local_dc;
        }
      }
      else {
        max_quotient1 = 0;
        for (uVar3 = minus_k_1; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
          max_quotient1 = max_quotient1 + 1;
        }
        if (7 < (int)max_quotient1) {
          max_quotient1 = 7;
        }
        ret_value_1.significand = 0;
        for (; ((int)ret_value_1.significand < (int)(max_quotient1 - 1) &&
               ((uint)(minus_k_1 * -0x3d70a3d7) < 0xa3d70a4)); minus_k_1 = minus_k_1 * -0x3d70a3d7)
        {
          ret_value_1.significand = ret_value_1.significand + 2;
        }
        if (((int)ret_value_1.significand < (int)max_quotient1) &&
           ((uint)(minus_k_1 * -0x33333333) < 0x33333334)) {
          minus_k_1 = minus_k_1 * -0x33333333;
          ret_value_1.significand = ret_value_1.significand + 1;
        }
        minus_k_1 = (uint)minus_k_1 >> ((byte)ret_value_1.significand & 0x1f);
        iStack_4c = ret_value_1.significand + local_58 + 1;
      }
      dVar1.exponent = iStack_4c;
      dVar1.significand = minus_k_1;
      return dVar1;
    }
    uStack_88 = uStack_88 | 0x800000;
  }
  local_8e = (uStack_88 & 1) == 0;
  local_8d = local_8e;
  iVar6 = floor_log10_pow2(minus_k);
  cache._4_4_ = iVar6 + -1;
  _deltai = cache_accessor<float>::get_cached_power(-cache._4_4_);
  iVar6 = minus_k;
  iVar5 = floor_log2_pow10(-cache._4_4_);
  two_fc = iVar6 + iVar5;
  two_fr = cache_accessor<float>::compute_delta((cache_entry_type *)&deltai,two_fc);
  zi = uStack_88 << 1;
  r = zi | 1;
  two_fl = cache_accessor<float>::compute_mul
                     (r << ((byte)two_fc & 0x1f),(cache_entry_type *)&deltai);
  uVar3 = divide_by_10_to_kappa_plus_1(two_fl);
  mask = two_fl + uVar3 * -100;
  if (mask <= two_fr) {
    if (mask < two_fr) {
      if (((mask != 0) || ((local_8e & 1) != 0)) ||
         (bVar2 = is_endpoint_integer<float>(r,minus_k,cache._4_4_), !bVar2)) {
LAB_00148734:
        _br = (decimal_fp<float>)CONCAT44(cache._4_4_ + 2,uVar3);
        max_quotient1_1 = 0;
        for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
          max_quotient1_1 = max_quotient1_1 + 1;
        }
        if (7 < (int)max_quotient1_1) {
          max_quotient1_1 = 7;
        }
        local_28 = 0;
        while ((local_28 < (int)(max_quotient1_1 - 1) && (br * -0x3d70a3d7 < 0xa3d70a4))) {
          br = br * -0x3d70a3d7;
          local_28 = local_28 + 2;
        }
        if ((local_28 < (int)max_quotient1_1) && (br * -0x33333333 < 0x33333334)) {
          br = br * -0x33333333;
          local_28 = local_28 + 1;
        }
        br = br >> ((byte)local_28 & 0x1f);
        x_local = (float)SUB84(_br,4);
        br = SUB84(_br,0);
        x_local = (float)(local_28 + (int)x_local);
        return _br;
      }
      uVar3 = uVar3 - 1;
      mask = 100;
    }
    else {
      dist = zi - 1;
      if ((((local_8d & 1) != 0) &&
          (bVar2 = is_endpoint_integer<float>(dist,minus_k,cache._4_4_), bVar2)) ||
         (bVar2 = cache_accessor<float>::compute_mul_parity(dist,(cache_entry_type *)&deltai,two_fc)
         , bVar2)) goto LAB_00148734;
    }
  }
  iVar6 = uVar3 * 10;
  iVar5 = cache._4_4_ + 1;
  uStack_c0 = 1;
  local_c4 = (mask - (two_fr >> 1)) + 5;
  if ((local_c4 & 1) == 0) {
    uVar3 = local_c4 ^ 5;
    local_c4 = local_c4 >> 1;
    bVar2 = check_divisibility_and_divide_by_pow5<1>(&local_c4);
    if (bVar2) {
      x_local = (float)iVar5;
      br = local_c4 + iVar6;
      bVar2 = cache_accessor<float>::compute_mul_parity(zi,(cache_entry_type *)&deltai,two_fc);
      if (bVar2 == ((uVar3 & 1) != 0)) {
        bVar2 = is_center_integer<float>(zi,minus_k,cache._4_4_);
        if (bVar2) {
          if (((ulong)_br & 1) == 0) {
            local_e4 = br;
          }
          else {
            local_e4 = br - 1;
          }
          br = local_e4;
        }
      }
      else {
        br = br - 1;
      }
    }
    else {
      x_local = (float)iVar5;
      br = local_c4 + iVar6;
    }
  }
  else {
    uVar7 = small_division_by_pow10<1>(local_c4);
    x_local = (float)iVar5;
    br = uVar7 + iVar6;
  }
  return _br;
}

Assistant:

decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}